

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O0

void server(void *arg)

{
  bool bVar1;
  int iVar2;
  int aiStack_34c [191];
  int num;
  int tid;
  char *buf;
  int res [10];
  int local_18;
  int sock;
  int count;
  int bytes;
  void *arg_local;
  
  res[9] = nn_socket(1,0x51);
  if (res[9] < 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sock >= 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
            ,0x31);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar2 = nn_bind(res[9]);
  if (iVar2 < 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_bind(sock, SOCKET_ADDRESS) >= 0",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
            ,0x32);
    fflush(_stderr);
    nn_err_abort();
  }
  local_18 = 100;
  memset(&buf,0,0x28);
  while( true ) {
    if (local_18 < 1) {
      nn_close(res[9]);
      return;
    }
    _num = (char *)0x0;
    iVar2 = nn_recv(res[9],&num,0xffffffffffffffff,0);
    if (iVar2 < 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bytes >= 0",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x3b);
      fflush(_stderr);
      nn_err_abort();
    }
    if (iVar2 < 2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","bytes >= 2",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x3c);
      fflush(_stderr);
      nn_err_abort();
    }
    bVar1 = false;
    if ('@' < *_num) {
      bVar1 = *_num < '[';
    }
    if (!bVar1) break;
    bVar1 = false;
    if ('`' < _num[1]) {
      bVar1 = *_num < '{';
    }
    if (!bVar1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf[1] >= \'a\' && buf[0] <= \'z\'",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x3e);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = *_num + -0x41;
    if (9 < iVar2) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","tid < THREAD_COUNT",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x41);
      fflush(_stderr);
      nn_err_abort();
    }
    if (res[(long)iVar2 + -2] != _num[1] + -0x61) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","res[tid] == num",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c"
              ,0x42);
      fflush(_stderr);
      nn_err_abort();
    }
    res[(long)iVar2 + -2] = _num[1] + -0x60;
    nn_freemsg(_num);
    local_18 = local_18 + -1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","buf[0] >= \'A\' && buf[0] <= \'Z\'",
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/ipc_stress.c",
          0x3d);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void server(NN_UNUSED void *arg)
{
    int bytes;
    int count;
    int sock = nn_socket(AF_SP, NN_PULL);
    int res[TEST_LOOPS];
    nn_assert(sock >= 0);
    nn_assert(nn_bind(sock, SOCKET_ADDRESS) >= 0);
    count = THREAD_COUNT * TEST_LOOPS;
    memset(res, 0, sizeof (res));
    while (count > 0)
    {
        char *buf = NULL;
        int tid;
        int num;
        bytes = nn_recv(sock, &buf, NN_MSG, 0);
        nn_assert(bytes >= 0);
        nn_assert(bytes >= 2);
        nn_assert(buf[0] >= 'A' && buf[0] <= 'Z');
        nn_assert(buf[1] >= 'a' && buf[0] <= 'z');
        tid = buf[0]-'A';
        num = buf[1]-'a';
        nn_assert(tid < THREAD_COUNT);
        nn_assert(res[tid] == num);
        res[tid]=num+1;
        nn_freemsg(buf);
        count--;
    }
    nn_close(sock);
}